

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_BufferManager.cc
# Opt level: O0

MyDB_PageHandle __thiscall
MyDB_BufferManager::getPinnedPage(MyDB_BufferManager *this,MyDB_TablePtr *table,long index)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  MyDB_PageHandle MVar2;
  shared_ptr<MyDB_Table> local_40;
  undefined1 local_29;
  long index_local;
  MyDB_TablePtr *table_local;
  MyDB_BufferManager *this_local;
  MyDB_PageHandle *phd;
  
  local_29 = 0;
  index_local = index;
  table_local = table;
  this_local = this;
  std::shared_ptr<MyDB_Table>::shared_ptr(&local_40,(shared_ptr<MyDB_Table> *)index);
  getPage(this,table,(long)&local_40);
  std::shared_ptr<MyDB_Table>::~shared_ptr(&local_40);
  peVar1 = std::__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar1->pagePtr->isPined = true;
  MVar2.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar2.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MyDB_PageHandle)MVar2.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MyDB_PageHandle MyDB_BufferManager :: getPinnedPage (MyDB_TablePtr table, long index) {
	MyDB_PageHandle phd = getPage (table, index);
	phd -> pagePtr -> isPined = true;
	return phd;
}